

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O3

string * TidyConfigParser::formatCheckName(string *__return_storage_ptr__,string *checkName)

{
  pointer pcVar1;
  ulong uVar2;
  int iVar3;
  void *pvVar4;
  size_type sVar5;
  long lVar6;
  size_type sVar7;
  ulong uVar8;
  ulong uVar9;
  _Alloc_hider _Var10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (checkName->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (&local_70,checkName->_M_string_length,'\0');
  _Var10._M_p = local_70._M_dataplus._M_p;
  sVar5 = checkName->_M_string_length;
  if (sVar5 != 0) {
    pcVar1 = (checkName->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      iVar3 = tolower((int)pcVar1[sVar7]);
      _Var10._M_p[sVar7] = (char)iVar3;
      sVar7 = sVar7 + 1;
    } while (sVar5 != sVar7);
  }
  _Var10._M_p = local_70._M_dataplus._M_p;
  iVar3 = toupper((int)*local_70._M_dataplus._M_p);
  *_Var10._M_p = (char)iVar3;
  if (local_70._M_string_length == 0) {
LAB_001a5a6c:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_70.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_70._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_70._M_string_length;
    return __return_storage_ptr__;
  }
  sVar5 = 0;
  lVar6 = 0;
  do {
    lVar6 = lVar6 + (ulong)(local_70._M_dataplus._M_p[sVar5] == '-');
    sVar5 = sVar5 + 1;
  } while (local_70._M_string_length != sVar5);
  if (lVar6 == 0) goto LAB_001a5a6c;
  uVar2 = checkName->_M_string_length;
  uVar9 = 0;
  do {
    sVar5 = local_70._M_string_length;
    _Var10._M_p = local_70._M_dataplus._M_p;
    pvVar4 = memchr(local_70._M_dataplus._M_p + uVar9,0x2d,local_70._M_string_length - uVar9);
    uVar8 = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)_Var10._M_p;
    if (uVar2 <= uVar8) goto LAB_001a59a3;
    uVar9 = uVar8 + 1;
    iVar3 = toupper((int)_Var10._M_p[uVar8 + 1]);
    _Var10._M_p[uVar8 + 1] = (char)iVar3;
  } while (uVar9 < local_70._M_string_length);
  sVar5 = local_70._M_string_length;
  _Var10._M_p = local_70._M_dataplus._M_p;
  if (local_70._M_string_length == 0) {
LAB_001a5ab5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
LAB_001a59a3:
    pvVar4 = memchr(_Var10._M_p,0x2d,sVar5);
    if (pvVar4 == (void *)0x0) goto LAB_001a5ab5;
    lVar6 = (long)pvVar4 - (long)_Var10._M_p;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (lVar6 != -1) {
      sVar5 = 0;
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_50,&local_70,sVar5,lVar6 - sVar5);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        _Var10._M_p = local_70._M_dataplus._M_p;
        sVar5 = lVar6 + 1;
      } while (((sVar5 <= local_70._M_string_length && local_70._M_string_length - sVar5 != 0) &&
               (pvVar4 = memchr(local_70._M_dataplus._M_p + sVar5,0x2d,
                                local_70._M_string_length - sVar5), pvVar4 != (void *)0x0)) &&
              (lVar6 = (long)pvVar4 - (long)_Var10._M_p, lVar6 != -1));
      goto LAB_001a5acb;
    }
  }
  sVar5 = 0;
LAB_001a5acb:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_50,&local_70,sVar5,0xffffffffffffffff);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return __return_storage_ptr__;
  }
  operator_delete(local_70._M_dataplus._M_p,
                  CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                           local_70.field_2._M_local_buf[0]) + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string TidyConfigParser::formatCheckName(const std::string& checkName) {
    if (checkName.empty())
        return "";
    std::string capitalizedName;
    capitalizedName.resize(checkName.size());
    std::transform(checkName.begin(), checkName.end(), capitalizedName.begin(), ::tolower);
    // Input string is expected to have the format a-b-c-d-e...
    // Capitalize the first letter
    capitalizedName[0] = static_cast<char>(::toupper(capitalizedName[0]));
    if (std::count(capitalizedName.begin(), capitalizedName.end(), '-') == 0) {
        // If there are no '-' on the name, we are done
        return capitalizedName;
    }

    // Find all the '-' and capitalize the following char if exists
    auto nameLength = checkName.size();
    size_t pos = 0;
    while (true) {
        pos = capitalizedName.find('-', pos);
        // If pos+1 does not exist, or we have not found anymore '-' we can break.
        // Else capitalize the pos+1 letter
        if (pos == std::string::npos || nameLength <= pos)
            break;
        else {
            capitalizedName[pos + 1] = static_cast<char>(::toupper(capitalizedName[pos + 1]));
            pos += 1;
        }
    }

    // At this point the string should have the format Aa-Bb-Cc-....
    // Remove the '-' from the string and we are done
    size_t currentPos = 0;
    size_t nextPos = capitalizedName.find('-');
    std::string name;
    while (nextPos != std::string::npos) {
        name.append(capitalizedName.substr(currentPos, nextPos - currentPos));
        currentPos = nextPos + 1;
        nextPos = capitalizedName.find('-', currentPos);
    }
    name.append(capitalizedName.substr(currentPos));
    return name;
}